

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableLazyMessageOneofFieldGenerator::GenerateMergingCode
          (ImmutableLazyMessageOneofFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  ImmutableLazyMessageOneofFieldGenerator *this_local;
  
  io::Printer::Print(printer,&(this->super_ImmutableLazyMessageFieldGenerator).
                              super_ImmutableMessageFieldGenerator.variables_,
                     "if (!($has_oneof_case_message$)) {\n  $oneof_name$_ = new $lazy_type$();\n}\n(($lazy_type$) $oneof_name$_).merge(\n    ($lazy_type$) other.$oneof_name$_);\n$set_oneof_case_message$;\n"
                    );
  return;
}

Assistant:

void ImmutableLazyMessageOneofFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (!($has_oneof_case_message$)) {\n"
    "  $oneof_name$_ = new $lazy_type$();\n"
    "}\n"
    "(($lazy_type$) $oneof_name$_).merge(\n"
    "    ($lazy_type$) other.$oneof_name$_);\n"
    "$set_oneof_case_message$;\n");
}